

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitGraph.c
# Opt level: O2

Kit_Edge_t Kit_GraphAddNodeXor(Kit_Graph_t *pGraph,Kit_Edge_t eEdge0,Kit_Edge_t eEdge1,int Type)

{
  Kit_Edge_t KVar1;
  Kit_Edge_t KVar2;
  
  if (Type != 0) {
    KVar1 = Kit_GraphAddNodeAnd(pGraph,eEdge0,eEdge1);
    KVar2 = Kit_GraphAddNodeAnd(pGraph,(Kit_Edge_t)((uint)eEdge0 ^ 1),(Kit_Edge_t)((uint)eEdge1 ^ 1)
                               );
    KVar1 = Kit_GraphAddNodeOr(pGraph,KVar1,KVar2);
    return (Kit_Edge_t)((uint)KVar1 ^ 1);
  }
  KVar1 = Kit_GraphAddNodeAnd(pGraph,(Kit_Edge_t)((uint)eEdge0 ^ 1),eEdge1);
  KVar2 = Kit_GraphAddNodeAnd(pGraph,eEdge0,(Kit_Edge_t)((uint)eEdge1 ^ 1));
  KVar1 = Kit_GraphAddNodeOr(pGraph,KVar1,KVar2);
  return KVar1;
}

Assistant:

Kit_Edge_t Kit_GraphAddNodeXor( Kit_Graph_t * pGraph, Kit_Edge_t eEdge0, Kit_Edge_t eEdge1, int Type )
{
    Kit_Edge_t eNode0, eNode1, eNode;
    if ( Type == 0 )
    {
        // derive the first AND
        eEdge0.fCompl ^= 1;
        eNode0 = Kit_GraphAddNodeAnd( pGraph, eEdge0, eEdge1 );
        eEdge0.fCompl ^= 1;
        // derive the second AND
        eEdge1.fCompl ^= 1;
        eNode1 = Kit_GraphAddNodeAnd( pGraph, eEdge0, eEdge1 );
        // derive the final OR
        eNode = Kit_GraphAddNodeOr( pGraph, eNode0, eNode1 );
    }
    else
    {
        // derive the first AND
        eNode0 = Kit_GraphAddNodeAnd( pGraph, eEdge0, eEdge1 );
        // derive the second AND
        eEdge0.fCompl ^= 1;
        eEdge1.fCompl ^= 1;
        eNode1 = Kit_GraphAddNodeAnd( pGraph, eEdge0, eEdge1 );
        // derive the final OR
        eNode = Kit_GraphAddNodeOr( pGraph, eNode0, eNode1 );
        eNode.fCompl ^= 1;
    }
    return eNode;
}